

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module_info.cpp
# Opt level: O3

HTTPResponse * http_request_handler(Client *client)

{
  undefined8 *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  bool bVar5;
  char cVar6;
  HTTPResponse *this;
  long *plVar7;
  undefined8 *puVar8;
  ulong *puVar9;
  size_type *psVar10;
  ulong uVar11;
  char cVar12;
  long lVar13;
  ulong uVar14;
  list<std::tuple<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string>>>
  *__position;
  string __str_7;
  string __str_6;
  string __str_4;
  string __str_3;
  string __str_2;
  string __str_1;
  string __str;
  string __str_5;
  _Head_base<1UL,_const_char_*,_false> local_378;
  size_type local_370;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_368;
  _Tuple_impl<0UL,_const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_358;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_330;
  ulong *local_2f0;
  uint local_2e8;
  undefined4 uStack_2e4;
  ulong local_2e0 [2];
  ulong *local_2d0;
  uint local_2c8;
  undefined4 uStack_2c4;
  ulong local_2c0 [2];
  ulong *local_2b0;
  uint local_2a8;
  undefined4 uStack_2a4;
  ulong local_2a0 [2];
  ulong *local_290;
  uint local_288;
  undefined4 uStack_284;
  ulong local_280 [2];
  ulong *local_270;
  uint local_268;
  undefined4 uStack_264;
  ulong local_260 [2];
  ulong *local_250;
  uint local_248;
  undefined4 uStack_244;
  ulong local_240 [2];
  ulong *local_230;
  long local_228;
  ulong local_220;
  long lStack_218;
  ulong *local_210;
  long local_208;
  ulong local_200;
  long lStack_1f8;
  ulong *local_1f0;
  long local_1e8;
  ulong local_1e0;
  long lStack_1d8;
  ulong *local_1d0;
  long local_1c8;
  ulong local_1c0;
  long lStack_1b8;
  ulong *local_1b0;
  long local_1a8;
  ulong local_1a0;
  long lStack_198;
  ulong *local_190;
  long local_188;
  ulong local_180;
  long lStack_178;
  undefined8 *local_170;
  undefined8 local_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 *local_150;
  undefined8 local_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 *local_130;
  undefined8 local_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 *local_110;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 *local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 *local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 *local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  ulong *local_90;
  uint local_88;
  undefined4 uStack_84;
  ulong local_80 [2];
  ulong *local_70;
  long local_68;
  ulong local_60;
  long lStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (*(ulong *)(client + 0x28) < 5) {
    return (HTTPResponse *)0x0;
  }
  lVar13 = 0;
  do {
    if (*(char *)(*(long *)(client + 0x20) + lVar13) != "/info"[lVar13]) {
      return (HTTPResponse *)0x0;
    }
    lVar13 = lVar13 + 1;
  } while (lVar13 != 5);
  if ((*(ulong *)(client + 0x28) != 5) && (*(char *)(*(long *)(client + 0x20) + 5) != '/')) {
    return (HTTPResponse *)0x0;
  }
  this = (HTTPResponse *)operator_new(0x98);
  HTTPResponse::HTTPResponse(this);
  std::__cxx11::string::_M_replace((ulong)this,0,*(char **)(this + 8),0x14406a);
  std::__cxx11::string::_M_replace((ulong)(this + 0x20),0,*(char **)(this + 0x28),0x144073);
  std::operator+(&local_50,
                 "<!DOCTYPE html><html><head><link rel=\"stylesheet\" type=\"text/css\" href=\"/static/nice.css\" media=\"screen\"/><script src=\"/static/nice.js\"></script></head><title>System Information</title><body><h1>System Information</h1><div class=\"entry\"><input type=\"button\" value=\"Kernel Version\" class=\"button\" onclick=\"ToggleBetweenDisplayAndHide(\'KernelVersion\')\"/><div id=\"KernelVersion\" class=\"hide\"><div class=\"text\">"
                 ,&version_abi_cxx11_);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_50);
  puVar9 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar9) {
    local_220 = *puVar9;
    lStack_218 = plVar7[3];
    local_230 = &local_220;
  }
  else {
    local_220 = *puVar9;
    local_230 = (ulong *)*plVar7;
  }
  local_228 = plVar7[1];
  *plVar7 = (long)puVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  uVar14 = mem_total >> 10;
  cVar12 = '\x01';
  if (0x27ff < mem_total) {
    uVar11 = uVar14;
    cVar6 = '\x04';
    do {
      cVar12 = cVar6;
      if (uVar11 < 100) {
        cVar12 = cVar12 + -2;
        goto LAB_00121a05;
      }
      if (uVar11 < 1000) {
        cVar12 = cVar12 + -1;
        goto LAB_00121a05;
      }
      if (uVar11 < 10000) goto LAB_00121a05;
      bVar5 = 99999 < uVar11;
      uVar11 = uVar11 / 10000;
      cVar6 = cVar12 + '\x04';
    } while (bVar5);
    cVar12 = cVar12 + '\x01';
  }
LAB_00121a05:
  local_250 = local_240;
  std::__cxx11::string::_M_construct((ulong)&local_250,cVar12);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_250,local_248,uVar14);
  uVar14 = CONCAT44(uStack_244,local_248) + local_228;
  uVar11 = 0xf;
  if (local_230 != &local_220) {
    uVar11 = local_220;
  }
  if (uVar11 < uVar14) {
    uVar11 = 0xf;
    if (local_250 != local_240) {
      uVar11 = local_240[0];
    }
    if (uVar11 < uVar14) goto LAB_00121a8b;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_250,0,(char *)0x0,(ulong)local_230);
  }
  else {
LAB_00121a8b:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_230,(ulong)local_250);
  }
  local_170 = &local_160;
  puVar1 = puVar8 + 2;
  if ((undefined8 *)*puVar8 == puVar1) {
    local_160 = *puVar1;
    uStack_158 = puVar8[3];
  }
  else {
    local_160 = *puVar1;
    local_170 = (undefined8 *)*puVar8;
  }
  local_168 = puVar8[1];
  *puVar8 = puVar1;
  puVar8[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_170);
  puVar9 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar9) {
    local_200 = *puVar9;
    lStack_1f8 = plVar7[3];
    local_210 = &local_200;
  }
  else {
    local_200 = *puVar9;
    local_210 = (ulong *)*plVar7;
  }
  local_208 = plVar7[1];
  *plVar7 = (long)puVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  uVar14 = mem_free >> 10;
  cVar12 = '\x01';
  if (0x27ff < mem_free) {
    uVar11 = uVar14;
    cVar6 = '\x04';
    do {
      cVar12 = cVar6;
      if (uVar11 < 100) {
        cVar12 = cVar12 + -2;
        goto LAB_00121bd0;
      }
      if (uVar11 < 1000) {
        cVar12 = cVar12 + -1;
        goto LAB_00121bd0;
      }
      if (uVar11 < 10000) goto LAB_00121bd0;
      bVar5 = 99999 < uVar11;
      uVar11 = uVar11 / 10000;
      cVar6 = cVar12 + '\x04';
    } while (bVar5);
    cVar12 = cVar12 + '\x01';
  }
LAB_00121bd0:
  local_270 = local_260;
  std::__cxx11::string::_M_construct((ulong)&local_270,cVar12);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_270,local_268,uVar14);
  uVar14 = CONCAT44(uStack_264,local_268) + local_208;
  uVar11 = 0xf;
  if (local_210 != &local_200) {
    uVar11 = local_200;
  }
  if (uVar11 < uVar14) {
    uVar11 = 0xf;
    if (local_270 != local_260) {
      uVar11 = local_260[0];
    }
    if (uVar11 < uVar14) goto LAB_00121c56;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_270,0,(char *)0x0,(ulong)local_210);
  }
  else {
LAB_00121c56:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_210,(ulong)local_270);
  }
  local_150 = &local_140;
  puVar1 = puVar8 + 2;
  if ((undefined8 *)*puVar8 == puVar1) {
    local_140 = *puVar1;
    uStack_138 = puVar8[3];
  }
  else {
    local_140 = *puVar1;
    local_150 = (undefined8 *)*puVar8;
  }
  local_148 = puVar8[1];
  *puVar8 = puVar1;
  puVar8[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_150);
  puVar9 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar9) {
    local_1e0 = *puVar9;
    lStack_1d8 = plVar7[3];
    local_1f0 = &local_1e0;
  }
  else {
    local_1e0 = *puVar9;
    local_1f0 = (ulong *)*plVar7;
  }
  local_1e8 = plVar7[1];
  *plVar7 = (long)puVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  uVar14 = mem_available >> 10;
  cVar12 = '\x01';
  if (0x27ff < mem_available) {
    uVar11 = uVar14;
    cVar6 = '\x04';
    do {
      cVar12 = cVar6;
      if (uVar11 < 100) {
        cVar12 = cVar12 + -2;
        goto LAB_00121d9b;
      }
      if (uVar11 < 1000) {
        cVar12 = cVar12 + -1;
        goto LAB_00121d9b;
      }
      if (uVar11 < 10000) goto LAB_00121d9b;
      bVar5 = 99999 < uVar11;
      uVar11 = uVar11 / 10000;
      cVar6 = cVar12 + '\x04';
    } while (bVar5);
    cVar12 = cVar12 + '\x01';
  }
LAB_00121d9b:
  local_290 = local_280;
  std::__cxx11::string::_M_construct((ulong)&local_290,cVar12);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_290,local_288,uVar14);
  uVar14 = CONCAT44(uStack_284,local_288) + local_1e8;
  uVar11 = 0xf;
  if (local_1f0 != &local_1e0) {
    uVar11 = local_1e0;
  }
  if (uVar11 < uVar14) {
    uVar11 = 0xf;
    if (local_290 != local_280) {
      uVar11 = local_280[0];
    }
    if (uVar11 < uVar14) goto LAB_00121e21;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_290,0,(char *)0x0,(ulong)local_1f0);
  }
  else {
LAB_00121e21:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1f0,(ulong)local_290);
  }
  local_130 = &local_120;
  puVar1 = puVar8 + 2;
  if ((undefined8 *)*puVar8 == puVar1) {
    local_120 = *puVar1;
    uStack_118 = puVar8[3];
  }
  else {
    local_120 = *puVar1;
    local_130 = (undefined8 *)*puVar8;
  }
  local_128 = puVar8[1];
  *puVar8 = puVar1;
  puVar8[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_130);
  puVar9 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar9) {
    local_1c0 = *puVar9;
    lStack_1b8 = plVar7[3];
    local_1d0 = &local_1c0;
  }
  else {
    local_1c0 = *puVar9;
    local_1d0 = (ulong *)*plVar7;
  }
  local_1c8 = plVar7[1];
  *plVar7 = (long)puVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  uVar14 = disk_info.capacity >> 0x14;
  cVar12 = '\x01';
  if (0x9fffff < disk_info.capacity) {
    uVar11 = uVar14;
    cVar6 = '\x04';
    do {
      cVar12 = cVar6;
      if (uVar11 < 100) {
        cVar12 = cVar12 + -2;
        goto LAB_00121f66;
      }
      if (uVar11 < 1000) {
        cVar12 = cVar12 + -1;
        goto LAB_00121f66;
      }
      if (uVar11 < 10000) goto LAB_00121f66;
      bVar5 = 99999 < uVar11;
      uVar11 = uVar11 / 10000;
      cVar6 = cVar12 + '\x04';
    } while (bVar5);
    cVar12 = cVar12 + '\x01';
  }
LAB_00121f66:
  local_2b0 = local_2a0;
  std::__cxx11::string::_M_construct((ulong)&local_2b0,cVar12);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_2b0,local_2a8,uVar14);
  uVar14 = CONCAT44(uStack_2a4,local_2a8) + local_1c8;
  uVar11 = 0xf;
  if (local_1d0 != &local_1c0) {
    uVar11 = local_1c0;
  }
  if (uVar11 < uVar14) {
    uVar11 = 0xf;
    if (local_2b0 != local_2a0) {
      uVar11 = local_2a0[0];
    }
    if (uVar11 < uVar14) goto LAB_00121fec;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_2b0,0,(char *)0x0,(ulong)local_1d0);
  }
  else {
LAB_00121fec:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1d0,(ulong)local_2b0);
  }
  local_110 = &local_100;
  puVar1 = puVar8 + 2;
  if ((undefined8 *)*puVar8 == puVar1) {
    local_100 = *puVar1;
    uStack_f8 = puVar8[3];
  }
  else {
    local_100 = *puVar1;
    local_110 = (undefined8 *)*puVar8;
  }
  local_108 = puVar8[1];
  *puVar8 = puVar1;
  puVar8[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_110);
  puVar9 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar9) {
    local_1a0 = *puVar9;
    lStack_198 = plVar7[3];
    local_1b0 = &local_1a0;
  }
  else {
    local_1a0 = *puVar9;
    local_1b0 = (ulong *)*plVar7;
  }
  local_1a8 = plVar7[1];
  *plVar7 = (long)puVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  uVar14 = disk_info.free >> 0x14;
  cVar12 = '\x01';
  if (0x9fffff < disk_info.free) {
    uVar11 = uVar14;
    cVar6 = '\x04';
    do {
      cVar12 = cVar6;
      if (uVar11 < 100) {
        cVar12 = cVar12 + -2;
        goto LAB_00122131;
      }
      if (uVar11 < 1000) {
        cVar12 = cVar12 + -1;
        goto LAB_00122131;
      }
      if (uVar11 < 10000) goto LAB_00122131;
      bVar5 = 99999 < uVar11;
      uVar11 = uVar11 / 10000;
      cVar6 = cVar12 + '\x04';
    } while (bVar5);
    cVar12 = cVar12 + '\x01';
  }
LAB_00122131:
  local_2d0 = local_2c0;
  std::__cxx11::string::_M_construct((ulong)&local_2d0,cVar12);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_2d0,local_2c8,uVar14);
  uVar14 = CONCAT44(uStack_2c4,local_2c8) + local_1a8;
  uVar11 = 0xf;
  if (local_1b0 != &local_1a0) {
    uVar11 = local_1a0;
  }
  if (uVar11 < uVar14) {
    uVar11 = 0xf;
    if (local_2d0 != local_2c0) {
      uVar11 = local_2c0[0];
    }
    if (uVar11 < uVar14) goto LAB_001221b7;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_2d0,0,(char *)0x0,(ulong)local_1b0);
  }
  else {
LAB_001221b7:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1b0,(ulong)local_2d0);
  }
  local_f0 = &local_e0;
  puVar1 = puVar8 + 2;
  if ((undefined8 *)*puVar8 == puVar1) {
    local_e0 = *puVar1;
    uStack_d8 = puVar8[3];
  }
  else {
    local_e0 = *puVar1;
    local_f0 = (undefined8 *)*puVar8;
  }
  local_e8 = puVar8[1];
  *puVar8 = puVar1;
  puVar8[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_f0);
  puVar9 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar9) {
    local_180 = *puVar9;
    lStack_178 = plVar7[3];
    local_190 = &local_180;
  }
  else {
    local_180 = *puVar9;
    local_190 = (ulong *)*plVar7;
  }
  local_188 = plVar7[1];
  *plVar7 = (long)puVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  uVar14 = disk_info.available >> 0x14;
  cVar12 = '\x01';
  if (0x9fffff < disk_info.available) {
    uVar11 = uVar14;
    cVar6 = '\x04';
    do {
      cVar12 = cVar6;
      if (uVar11 < 100) {
        cVar12 = cVar12 + -2;
        goto LAB_001222fc;
      }
      if (uVar11 < 1000) {
        cVar12 = cVar12 + -1;
        goto LAB_001222fc;
      }
      if (uVar11 < 10000) goto LAB_001222fc;
      bVar5 = 99999 < uVar11;
      uVar11 = uVar11 / 10000;
      cVar6 = cVar12 + '\x04';
    } while (bVar5);
    cVar12 = cVar12 + '\x01';
  }
LAB_001222fc:
  local_90 = local_80;
  std::__cxx11::string::_M_construct((ulong)&local_90,cVar12);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_90,local_88,uVar14);
  uVar14 = CONCAT44(uStack_84,local_88) + local_188;
  uVar11 = 0xf;
  if (local_190 != &local_180) {
    uVar11 = local_180;
  }
  if (uVar11 < uVar14) {
    uVar11 = 0xf;
    if (local_90 != local_80) {
      uVar11 = local_80[0];
    }
    if (uVar11 < uVar14) goto LAB_00122382;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_190);
  }
  else {
LAB_00122382:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_190,(ulong)local_90);
  }
  local_d0 = &local_c0;
  puVar1 = puVar8 + 2;
  if ((undefined8 *)*puVar8 == puVar1) {
    local_c0 = *puVar1;
    uStack_b8 = puVar8[3];
  }
  else {
    local_c0 = *puVar1;
    local_d0 = (undefined8 *)*puVar8;
  }
  local_c8 = puVar8[1];
  *puVar8 = puVar1;
  puVar8[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_d0);
  puVar9 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar9) {
    local_60 = *puVar9;
    lStack_58 = plVar7[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *puVar9;
    local_70 = (ulong *)*plVar7;
  }
  local_68 = plVar7[1];
  *plVar7 = (long)puVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  uVar14 = ((long)processes_info_abi_cxx11_.
                  super__Vector_base<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)processes_info_abi_cxx11_.
                  super__Vector_base<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7;
  cVar12 = '\x01';
  if (9 < uVar14) {
    uVar11 = uVar14;
    cVar6 = '\x04';
    do {
      cVar12 = cVar6;
      if (uVar11 < 100) {
        cVar12 = cVar12 + -2;
        goto LAB_001224d5;
      }
      if (uVar11 < 1000) {
        cVar12 = cVar12 + -1;
        goto LAB_001224d5;
      }
      if (uVar11 < 10000) goto LAB_001224d5;
      bVar5 = 99999 < uVar11;
      uVar11 = uVar11 / 10000;
      cVar6 = cVar12 + '\x04';
    } while (bVar5);
    cVar12 = cVar12 + '\x01';
  }
LAB_001224d5:
  local_2f0 = local_2e0;
  std::__cxx11::string::_M_construct((ulong)&local_2f0,cVar12);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_2f0,local_2e8,uVar14);
  uVar14 = CONCAT44(uStack_2e4,local_2e8) + local_68;
  uVar11 = 0xf;
  if (local_70 != &local_60) {
    uVar11 = local_60;
  }
  if (uVar11 < uVar14) {
    uVar11 = 0xf;
    if (local_2f0 != local_2e0) {
      uVar11 = local_2e0[0];
    }
    if (uVar14 <= uVar11) {
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_2f0,0,(char *)0x0,(ulong)local_70);
      goto LAB_00122583;
    }
  }
  puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_2f0);
LAB_00122583:
  local_b0 = &local_a0;
  puVar1 = puVar8 + 2;
  if ((undefined8 *)*puVar8 == puVar1) {
    local_a0 = *puVar1;
    uStack_98 = puVar8[3];
  }
  else {
    local_a0 = *puVar1;
    local_b0 = (undefined8 *)*puVar8;
  }
  local_a8 = puVar8[1];
  *puVar8 = puVar1;
  puVar8[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_b0);
  puVar9 = (ulong *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar9) {
    local_368._M_allocated_capacity = *puVar9;
    local_368._8_8_ = plVar7[3];
    local_378._M_head_impl = (char *)&local_368;
  }
  else {
    local_368._M_allocated_capacity = *puVar9;
    local_378._M_head_impl = (char *)*plVar7;
  }
  local_370 = plVar7[1];
  *plVar7 = (long)puVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_378,(ulong)processes_data_abi_cxx11_._M_dataplus._M_p);
  local_358.
  super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  ._M_head_impl._M_dataplus._M_p =
       (pointer)&local_358.
                 super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 .
                 super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                 ._M_head_impl.field_2;
  psVar10 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_358.
    super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    ._M_head_impl.field_2._M_allocated_capacity = *psVar10;
    local_358.
    super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    ._M_head_impl.field_2._8_8_ = plVar7[3];
  }
  else {
    local_358.
    super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    ._M_head_impl.field_2._M_allocated_capacity = *psVar10;
    local_358.
    super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    ._M_head_impl._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_358.
  super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  ._M_head_impl._M_string_length = plVar7[1];
  *plVar7 = (long)psVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_358);
  paVar2 = &local_330.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .
            super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .
            super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
            ._M_head_impl.field_2;
  psVar10 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_330.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    ._M_head_impl.field_2._M_allocated_capacity = *psVar10;
    local_330.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    ._M_head_impl.field_2._8_8_ = plVar7[3];
    local_330.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    ._M_head_impl._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_330.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    ._M_head_impl.field_2._M_allocated_capacity = *psVar10;
    local_330.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    ._M_head_impl._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_330.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  ._M_head_impl._M_string_length = plVar7[1];
  *plVar7 = (long)psVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::__cxx11::string::operator=((string *)(this + 0x58),(string *)&local_330);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .
         super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .
         super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
         ._M_head_impl._M_dataplus._M_p != paVar2) {
    operator_delete(local_330.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .
                    super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .
                    super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                    ._M_head_impl._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358.
         super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .
         super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
         ._M_head_impl._M_dataplus._M_p !=
      &local_358.
       super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       .
       super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
       ._M_head_impl.field_2) {
    operator_delete(local_358.
                    super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .
                    super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                    ._M_head_impl._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378._M_head_impl != &local_368) {
    operator_delete(local_378._M_head_impl);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0);
  }
  if (local_2f0 != local_2e0) {
    operator_delete(local_2f0);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0);
  }
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  if (local_190 != &local_180) {
    operator_delete(local_190);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0);
  }
  if (local_2d0 != local_2c0) {
    operator_delete(local_2d0);
  }
  if (local_1b0 != &local_1a0) {
    operator_delete(local_1b0);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110);
  }
  if (local_2b0 != local_2a0) {
    operator_delete(local_2b0);
  }
  if (local_1d0 != &local_1c0) {
    operator_delete(local_1d0);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130);
  }
  if (local_290 != local_280) {
    operator_delete(local_290);
  }
  if (local_1f0 != &local_1e0) {
    operator_delete(local_1f0);
  }
  paVar2 = &local_358.
            super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .
            super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
            ._M_head_impl.field_2;
  if (local_150 != &local_140) {
    operator_delete(local_150);
  }
  if (local_270 != local_260) {
    operator_delete(local_270);
  }
  if (local_210 != &local_200) {
    operator_delete(local_210);
  }
  if (local_170 != &local_160) {
    operator_delete(local_170);
  }
  if (local_250 != local_240) {
    operator_delete(local_250);
  }
  if (local_230 != &local_220) {
    operator_delete(local_230);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  __position = (list<std::tuple<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string>>>
                *)(this + 0x40);
  local_358.
  super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  ._M_head_impl._M_dataplus._M_p = "Webe/0.1";
  local_358.
  super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  ._M_head_impl._M_string_length = 0x1446cc;
  std::_Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string>::
  _Tuple_impl<char_const*,char_const*>
            ((_Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string> *)&local_330,
             (_Tuple_impl<0UL,_const_char_*,_const_char_*> *)&local_358);
  std::__cxx11::
  list<std::tuple<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string>>>
  ::_M_insert<std::tuple<std::__cxx11::string,std::__cxx11::string>>
            (__position,(iterator)__position,&local_330);
  paVar3 = &local_330.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
            ._M_head_impl.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
         ._M_head_impl._M_dataplus._M_p != paVar3) {
    operator_delete(local_330.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                    ._M_head_impl._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .
         super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .
         super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
         ._M_head_impl._M_dataplus._M_p !=
      &local_330.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       .
       super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       .
       super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
       ._M_head_impl.field_2) {
    operator_delete(local_330.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .
                    super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .
                    super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                    ._M_head_impl._M_dataplus._M_p);
  }
  HTTPResponse::date_abi_cxx11_();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378._M_head_impl == &local_368) {
    local_358.
    super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    ._M_head_impl.field_2._8_8_ = local_368._8_8_;
    local_358.
    super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    ._M_head_impl._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_358.
    super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    ._M_head_impl._M_dataplus._M_p = local_378._M_head_impl;
  }
  local_358.
  super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  ._M_head_impl.field_2._M_allocated_capacity = local_368._M_allocated_capacity;
  local_358.
  super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  ._M_head_impl._M_string_length = local_370;
  local_370 = 0;
  local_368._M_allocated_capacity = local_368._M_allocated_capacity & 0xffffffffffffff00;
  local_358.super__Head_base<0UL,_const_char_*,_false>._M_head_impl = "Date";
  local_378._M_head_impl = (char *)&local_368;
  std::_Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string>::
  _Tuple_impl<char_const*,std::__cxx11::string>
            ((_Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string> *)&local_330,&local_358);
  std::__cxx11::
  list<std::tuple<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string>>>
  ::_M_insert<std::tuple<std::__cxx11::string,std::__cxx11::string>>
            (__position,(iterator)__position,&local_330);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
         ._M_head_impl._M_dataplus._M_p != paVar3) {
    operator_delete(local_330.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                    ._M_head_impl._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .
         super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .
         super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
         ._M_head_impl._M_dataplus._M_p !=
      &local_330.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       .
       super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       .
       super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
       ._M_head_impl.field_2) {
    operator_delete(local_330.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .
                    super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .
                    super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                    ._M_head_impl._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358.
         super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .
         super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
         ._M_head_impl._M_dataplus._M_p != paVar2) {
    operator_delete(local_358.
                    super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .
                    super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                    ._M_head_impl._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378._M_head_impl != &local_368) {
    operator_delete(local_378._M_head_impl);
  }
  local_358.
  super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  ._M_head_impl._M_dataplus._M_p = "text/html";
  local_358.
  super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  ._M_head_impl._M_string_length = 0x1446e1;
  std::_Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string>::
  _Tuple_impl<char_const*,char_const*>
            ((_Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string> *)&local_330,
             (_Tuple_impl<0UL,_const_char_*,_const_char_*> *)&local_358);
  std::__cxx11::
  list<std::tuple<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string>>>
  ::_M_insert<std::tuple<std::__cxx11::string,std::__cxx11::string>>
            (__position,(iterator)__position,&local_330);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
         ._M_head_impl._M_dataplus._M_p != paVar3) {
    operator_delete(local_330.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                    ._M_head_impl._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .
         super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .
         super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
         ._M_head_impl._M_dataplus._M_p !=
      &local_330.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       .
       super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       .
       super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
       ._M_head_impl.field_2) {
    operator_delete(local_330.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .
                    super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .
                    super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                    ._M_head_impl._M_dataplus._M_p);
  }
  uVar14 = *(ulong *)(this + 0x60);
  cVar12 = '\x01';
  if (9 < uVar14) {
    uVar11 = uVar14;
    cVar6 = '\x04';
    do {
      cVar12 = cVar6;
      if (uVar11 < 100) {
        cVar12 = cVar12 + -2;
        goto LAB_00122b01;
      }
      if (uVar11 < 1000) {
        cVar12 = cVar12 + -1;
        goto LAB_00122b01;
      }
      if (uVar11 < 10000) goto LAB_00122b01;
      bVar5 = 99999 < uVar11;
      uVar11 = uVar11 / 10000;
      cVar6 = cVar12 + '\x04';
    } while (bVar5);
    cVar12 = cVar12 + '\x01';
  }
LAB_00122b01:
  local_378._M_head_impl = (char *)&local_368;
  std::__cxx11::string::_M_construct((ulong)&local_378,cVar12);
  std::__detail::__to_chars_10_impl<unsigned_long>(local_378._M_head_impl,(uint)local_370,uVar14);
  paVar2 = &local_358.
            super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .
            super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
            ._M_head_impl.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378._M_head_impl == &local_368) {
    local_358.
    super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    ._M_head_impl.field_2._8_8_ = local_368._8_8_;
    local_358.
    super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    ._M_head_impl._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_358.
    super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    ._M_head_impl._M_dataplus._M_p = local_378._M_head_impl;
  }
  local_358.
  super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  ._M_head_impl.field_2._M_allocated_capacity = local_368._M_allocated_capacity;
  local_358.
  super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  ._M_head_impl._M_string_length = local_370;
  local_370 = 0;
  local_368._M_allocated_capacity = local_368._M_allocated_capacity & 0xffffffffffffff00;
  local_358.super__Head_base<0UL,_const_char_*,_false>._M_head_impl = "Content-Length";
  local_378._M_head_impl = (char *)&local_368;
  std::_Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string>::
  _Tuple_impl<char_const*,std::__cxx11::string>
            ((_Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string> *)&local_330,&local_358);
  paVar4 = &local_330.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .
            super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .
            super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
            ._M_head_impl.field_2;
  std::__cxx11::
  list<std::tuple<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string>>>
  ::_M_insert<std::tuple<std::__cxx11::string,std::__cxx11::string>>
            (__position,(iterator)__position,&local_330);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
         ._M_head_impl._M_dataplus._M_p != paVar3) {
    operator_delete(local_330.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                    ._M_head_impl._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .
         super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .
         super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
         ._M_head_impl._M_dataplus._M_p != paVar4) {
    operator_delete(local_330.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .
                    super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .
                    super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                    ._M_head_impl._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358.
         super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .
         super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
         ._M_head_impl._M_dataplus._M_p != paVar2) {
    operator_delete(local_358.
                    super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .
                    super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                    ._M_head_impl._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378._M_head_impl != &local_368) {
    operator_delete(local_378._M_head_impl);
  }
  local_358.
  super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  ._M_head_impl._M_dataplus._M_p = "keep-alive";
  local_358.
  super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  ._M_head_impl._M_string_length = 0x144707;
  std::_Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string>::
  _Tuple_impl<char_const*,char_const*>
            ((_Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string> *)&local_330,
             (_Tuple_impl<0UL,_const_char_*,_const_char_*> *)&local_358);
  std::__cxx11::
  list<std::tuple<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string>>>
  ::_M_insert<std::tuple<std::__cxx11::string,std::__cxx11::string>>
            (__position,(iterator)__position,&local_330);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
         ._M_head_impl._M_dataplus._M_p != paVar3) {
    operator_delete(local_330.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                    ._M_head_impl._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .
         super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .
         super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
         ._M_head_impl._M_dataplus._M_p != paVar4) {
    operator_delete(local_330.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .
                    super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .
                    super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                    ._M_head_impl._M_dataplus._M_p);
    return this;
  }
  return this;
}

Assistant:

static HTTPResponse *http_request_handler(Client *client) {
    if (match_path<p, 5>(client->request.uri)) {
        auto response = new HTTPResponse();
        response->version = "HTTP/1.1";
        response->status = "200 OK";
        response->data = \
                "<!DOCTYPE html>" \
                "<html>" \
                "<head>" \
                "<link rel=\"stylesheet\" type=\"text/css\" href=\"/static/nice.css\" media=\"screen\"/>" \
                "<script src=\"/static/nice.js\"></script>" \
                "</head>" \
                "<title>System Information</title>" \
                "<body>" \
                "<h1>System Information</h1>" \
                  "<div class=\"entry\">" \
                    "<input type=\"button\" value=\"Kernel Version\" class=\"button\" onclick=\"ToggleBetweenDisplayAndHide('KernelVersion')\"/>" \
                    "<div id=\"KernelVersion\" class=\"hide\">" \
                    "<div class=\"text\">" + version + \
                    "</div>" \
                    "</div>" \
                  "</div>" \
                  "<div class=\"entry\">" \
                    "<input type=\"button\" value=\"Memory Status\" class=\"button\" onclick=\"ToggleBetweenDisplayAndHide('MemoryUsage')\"/>" \
                    "<div id=\"MemoryUsage\" class=\"hide\">" \
                    "<table id=\"MemoryUsageTable\" class=\"table\" border=\"0\" style=\"width: 40%\">" \
                    "<tr><th align=\"left\">Total</th><td align=\"right\">" + std::to_string(mem_total / 1024) + " MiB</td></tr>" \
                    "<tr><th align=\"left\">Free</th><td align=\"right\">" + std::to_string(mem_free / 1024) + " MiB</td></tr>" \
                    "<tr><th align=\"left\">Available</th><td align=\"right\">" + std::to_string(mem_available / 1024) + " MiB</td></tr>" \
                    "</table>" \
                    "</div>" \
                  "</div>" \
                  "<div class=\"entry\">" \
                    "<input type=\"button\" value=\"Disk Status\" class=\"button\" onclick=\"ToggleBetweenDisplayAndHide('DiskStatus')\"/>" \
                    "<div id=\"DiskStatus\" class=\"hide\">" \
                    "<table class=\"table\" border=\"0\" style=\"width: 40%\">" \
                    "<tr><th align=\"left\">Capacity</th><td align=\"right\">" + std::to_string(disk_info.capacity / 1024 / 1024) + " MiB</td></tr>" \
                    "<tr><th align=\"left\">Free</th><td align=\"right\">" + std::to_string(disk_info.free / 1024 / 1024) + " MiB</td></tr>" \
                    "<tr><th align=\"left\">Available</th><td align=\"right\">" + std::to_string(disk_info.available / 1024 / 1024) + " MiB</td></tr>" \
                    "</table>" \
                    "</div>" \
                  "</div>" \
                  "<div class=\"entry\">" \
                    "<input type=\"button\" value=\"Processes Status\" class=\"button\" onclick=\"ToggleBetweenDisplayAndHide('ProcessesStatus')\"/>" \
                    "<div id=\"ProcessesStatus\" class=\"hide\">" \
                    "<table class=\"table\" border=\"0\" style=\"width: 40%\">" \
                    "<tr><th align=\"left\">Total</th><td align=\"right\">" + std::to_string(processes_info.size()) + "</td></tr>" \
                    "<tr><th align=\"left\">PID</th><td align=\"right\">NAME</td></tr>" \
                    + processes_data + "</table>" \
                    "</div>" \
                  "</div>" \
                "<div class=\"text\" align=\"right\">" \
                "&hearts; Fugoes" \
                "</div>"
                "</body>" \
                "</html>";

        response->header.push_back(std::make_tuple("Server", "Webe/0.1"));
        response->header.push_back(std::make_tuple("Date", HTTPResponse::date()));
        response->header.push_back(std::make_tuple("Content-Type", "text/html"));
        response->header.push_back(std::make_tuple("Content-Length", std::to_string(response->data.size())));
        response->header.push_back(std::make_tuple("Connection", "keep-alive"));
        return response;
    } else {
        return nullptr;
    }
}